

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

int MRIStepInnerStepper_GetForcingData
              (MRIStepInnerStepper stepper,realtype *tshift,realtype *tscale,N_Vector **forcing,
              int *nforcing)

{
  int iVar1;
  
  if (stepper == (MRIStepInnerStepper)0x0) {
    iVar1 = -0x16;
    arkProcessError((ARKodeMem)0x0,-0x16,"ARKode::MRIStep","MRIStepInnerStepper_GetForcingData",
                    "Inner stepper memory is NULL");
  }
  else {
    *tshift = stepper->tshift;
    *tscale = stepper->tscale;
    *forcing = stepper->forcing;
    *nforcing = stepper->nforcing;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int MRIStepInnerStepper_GetForcingData(MRIStepInnerStepper stepper,
                                       realtype *tshift, realtype *tscale,
                                       N_Vector **forcing, int *nforcing)
{
  if (stepper == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "MRIStepInnerStepper_GetForcingData",
                    "Inner stepper memory is NULL");
    return ARK_ILL_INPUT;
  }

  *tshift   = stepper->tshift;
  *tscale   = stepper->tscale;
  *forcing  = stepper->forcing;
  *nforcing = stepper->nforcing;

  return ARK_SUCCESS;
}